

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

char * load_ref_portion(BGZF *fp,ref_entry *e,int start,int end)

{
  int i;
  int iVar1;
  char *data;
  size_t sVar2;
  long lVar3;
  int iVar4;
  size_t __size;
  long lVar5;
  ulong uoffset;
  ulong uVar6;
  long lVar7;
  
  if (end <= start) {
    end = start;
  }
  iVar1 = e->line_length;
  if (iVar1 == 0) {
    uoffset = (ulong)(start - 1);
    uVar6 = (ulong)(end - 1);
  }
  else {
    iVar4 = e->bases_per_line;
    uoffset = ((long)(start + -1) % (long)iVar4 & 0xffffffffU) + e->offset +
              (long)(((start + -1) / iVar4) * iVar1);
    uVar6 = ((long)(end + -1) % (long)iVar4 & 0xffffffffU) + e->offset +
            (long)(((end + -1) / iVar4) * iVar1);
  }
  iVar1 = bgzf_useek(fp,uoffset,0);
  if (iVar1 < 0) {
    perror("bgzf_useek() on reference file");
  }
  else {
    lVar7 = uVar6 - uoffset;
    __size = lVar7 + 1;
    if ((__size != 0) && (data = (char *)malloc(__size), data != (char *)0x0)) {
      sVar2 = bgzf_read(fp,data,__size);
      if (__size == sVar2) {
        iVar1 = (end - start) + 1;
        if (__size == (long)iVar1) {
          for (lVar3 = 0; lVar3 <= lVar7; lVar3 = lVar3 + 1) {
            data[lVar3] = data[lVar3] & 0xdf;
          }
          return data;
        }
        iVar4 = 0;
        for (lVar3 = 0; lVar3 <= lVar7; lVar3 = lVar3 + 1) {
          if (0xa1 < (byte)(data[lVar3] + 0x81U)) {
            lVar5 = (long)iVar4;
            iVar4 = iVar4 + 1;
            data[lVar5] = data[lVar3] & 0x5f;
          }
        }
        if (iVar4 == iVar1) {
          return data;
        }
        fwrite("Malformed reference file?\n",0x1a,1,_stderr);
      }
      else {
        perror("bgzf_read() on reference file");
      }
      free(data);
    }
  }
  return (char *)0x0;
}

Assistant:

static char *load_ref_portion(BGZF *fp, ref_entry *e, int start, int end) {
    off_t offset, len;
    char *seq;

    if (end < start)
	end = start;

    /*
     * Compute locations in file. This is trivial for the MD5 files, but
     * is still necessary for the fasta variants.
     */
    offset = e->line_length
	? e->offset + (start-1)/e->bases_per_line * e->line_length +
	  (start-1) % e->bases_per_line
	: start-1;

    len = (e->line_length
	   ? e->offset + (end-1)/e->bases_per_line * e->line_length + 
	     (end-1) % e->bases_per_line
	   : end-1) - offset + 1;

    if (bgzf_useek(fp, offset, SEEK_SET) < 0) {
	perror("bgzf_useek() on reference file");
	return NULL;
    }

    if (len == 0 || !(seq = malloc(len))) {
	return NULL;
    }

    if (len != bgzf_read(fp, seq, len)) {
	perror("bgzf_read() on reference file");
	free(seq);
	return NULL;
    }

    /* Strip white-space if required. */
    if (len != end-start+1) {
	int i, j;
	char *cp = seq;
	char *cp_to;

	for (i = j = 0; i < len; i++) {
	    if (cp[i] >= '!' && cp[i] <= '~')
		cp[j++] = cp[i] & ~0x20;
	}
	cp_to = cp+j;

	if (cp_to - seq != end-start+1) {
	    fprintf(stderr, "Malformed reference file?\n");
	    free(seq);
	    return NULL;
	}
    } else {
	int i;
	for (i = 0; i < len; i++) {
	    seq[i] = seq[i] & ~0x20; // uppercase in ASCII
	}
    }

    return seq;
}